

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

uint __thiscall
ImGui::RoundScalarWithFormatT<unsigned_int,int>
          (ImGui *this,char *format,ImGuiDataType data_type,uint v)

{
  char *pcVar1;
  ImGui IVar2;
  undefined4 in_register_0000000c;
  ImGui *pIVar3;
  ImGui *pIVar4;
  int iVar5;
  char *src;
  double dVar6;
  char v_str [64];
  undefined4 local_4c;
  char local_48 [64];
  
  pIVar3 = (ImGui *)CONCAT44(in_register_0000000c,v);
  do {
    IVar2 = *this;
    if (IVar2 == (ImGui)0x0) {
      iVar5 = 3;
      pIVar4 = pIVar3;
    }
    else if ((IVar2 != (ImGui)0x25) || (iVar5 = 1, pIVar4 = this, this[1] == (ImGui)0x25)) {
      this = this + (ulong)(IVar2 == (ImGui)0x25) + 1;
      iVar5 = 0;
      pIVar4 = pIVar3;
    }
    pIVar3 = pIVar4;
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    this = pIVar4;
  }
  if ((*this == (ImGui)0x25) && (this[1] != (ImGui)0x25)) {
    local_4c = data_type;
    ImFormatString(local_48,0x40,(char *)this,data_type);
    src = (char *)((long)&local_4c + 3);
    do {
      pcVar1 = src + 1;
      src = src + 1;
    } while (*pcVar1 == ' ');
    if (((uint)format & 0xfffffffe) == 4) {
      dVar6 = atof(src);
      data_type = (ImGuiDataType)(long)dVar6;
    }
    else {
      ImAtoi<int>(src,&local_4c);
      data_type = local_4c;
    }
  }
  return data_type;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}